

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcatString.cpp
# Opt level: O0

ConcatStringBuilder * __thiscall Js::ConcatStringBuilder::GetHead(ConcatStringBuilder *this)

{
  ConcatStringBuilder *pCVar1;
  ConcatStringBuilder **ppCVar2;
  ConcatStringBuilder *head;
  ConcatStringBuilder *current;
  ConcatStringBuilder *this_local;
  
  pCVar1 = this;
  do {
    head = pCVar1;
    ppCVar2 = Memory::WriteBarrierPtr::operator_cast_to_ConcatStringBuilder__
                        ((WriteBarrierPtr *)&head->m_prevChunk);
    pCVar1 = *ppCVar2;
  } while (*ppCVar2 != (ConcatStringBuilder *)0x0);
  return head;
}

Assistant:

ConcatStringBuilder* ConcatStringBuilder::GetHead() const
    {
        ConcatStringBuilder* current = const_cast<ConcatStringBuilder*>(this);
        ConcatStringBuilder* head;
        do
        {
            head = current;
            current = current->m_prevChunk;
        } while (current != NULL);
        return head;
    }